

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cont_mgau.c
# Opt level: O1

int32 mgau_precomp(mgau_model_t *g)

{
  float fVar1;
  float32 **ainv;
  float32 *pfVar2;
  mgau_t *pmVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  float64 __x;
  double dVar7;
  double dVar8;
  
  if (g->verbose != 0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
            ,0x362,"Precomputing Mahalanobis distance invariants\n");
  }
  if (0 < g->n_mgau) {
    lVar6 = 0;
    do {
      pmVar3 = g->mgau;
      if (0 < pmVar3[lVar6].n_comp) {
        lVar4 = 0;
        do {
          if (pmVar3[lVar6].fullvar == (float32 ***)0x0) {
            if (g->veclen < 1) {
              dVar7 = 0.0;
            }
            else {
              dVar7 = 0.0;
              lVar5 = 0;
              do {
                dVar8 = log((double)(float)g->mgau[lVar6].var[lVar4][lVar5]);
                dVar7 = dVar7 + dVar8;
                pfVar2 = g->mgau[lVar6].var[lVar4];
                fVar1 = (float)pfVar2[lVar5];
                pfVar2[lVar5] = (float32)(1.0 / (fVar1 + fVar1));
                lVar5 = lVar5 + 1;
              } while (lVar5 < g->veclen);
            }
          }
          else {
            __x = determinant(pmVar3[lVar6].fullvar[lVar4],g->veclen);
            if ((double)__x <= 0.0) {
              __assert_fail("lrd > 0.0",
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
                            ,0x36b,"int32 mgau_precomp(mgau_model_t *)");
            }
            dVar7 = log((double)__x);
            ainv = g->mgau[lVar6].fullvar[lVar4];
            invert(ainv,ainv,g->veclen);
          }
          pmVar3 = g->mgau;
          pmVar3[lVar6].lrd[lVar4] =
               (float32)(float)(((double)g->veclen * 1.8378770664093453 + dVar7) * -0.5);
          lVar4 = lVar4 + 1;
        } while (lVar4 < pmVar3[lVar6].n_comp);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < g->n_mgau);
  }
  return 0;
}

Assistant:

int32
mgau_precomp(mgau_model_t * g)
{
    int32 m, c, i;
    float64 lrd;

    if (g->verbose)
        E_INFO("Precomputing Mahalanobis distance invariants\n");

    for (m = 0; m < mgau_n_mgau(g); m++) {
        for (c = 0; c < mgau_n_comp(g, m); c++) {
            if (g->mgau[m].fullvar) {
                lrd = determinant(g->mgau[m].fullvar[c], mgau_veclen(g));
                /* E_INFO("covariance mgau %d comp %d determinant = %g\n",
                   m, c, lrd); */
                /* Shouldn't happen, since we removed them earlier */
                assert(lrd > 0.0);
                lrd = log(lrd);
                invert(g->mgau[m].fullvar[c], g->mgau[m].fullvar[c],
                       mgau_veclen(g));
                /* Not doubling it here. */
            }
            else {
                lrd = 0.0;
                for (i = 0; i < mgau_veclen(g); i++) {
                    lrd += log(g->mgau[m].var[c][i]);

                    /* Precompute this part of the exponential */
                    g->mgau[m].var[c][i] =
                        (float32) (1.0 / (g->mgau[m].var[c][i] * 2.0));
                }
            }
            lrd += mgau_veclen(g) * log(2.0 * M_PI);      /* (2pi)^velen */
            mgau_lrd(g, m, c) = (float32) (-0.5 * lrd); /* Reciprocal, sqrt */
        }
    }

    return 0;
}